

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O1

SRC_STATE * linear_state_new(int channels,SRC_ERROR *error)

{
  SRC_STATE *__ptr;
  undefined4 *__ptr_00;
  void *pvVar1;
  LINEAR_DATA *priv;
  SRC_ERROR SVar2;
  
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_linear.c"
                  ,199,"SRC_STATE *linear_state_new(int, SRC_ERROR *)");
  }
  if (error == (SRC_ERROR *)0x0) {
    __assert_fail("error != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_linear.c"
                  ,200,"SRC_STATE *linear_state_new(int, SRC_ERROR *)");
  }
  __ptr = (SRC_STATE *)calloc(1,0x50);
  SVar2 = SRC_ERR_MALLOC_FAILED;
  if (__ptr != (SRC_STATE *)0x0) {
    __ptr->channels = channels;
    __ptr->mode = SRC_MODE_PROCESS;
    __ptr_00 = (undefined4 *)calloc(1,0x30);
    if (__ptr_00 == (undefined4 *)0x0) {
LAB_00101bbd:
      __ptr_00 = (undefined4 *)0x0;
    }
    else {
      *__ptr_00 = 0x787c4fc;
      pvVar1 = calloc((ulong)(uint)channels,4);
      *(void **)(__ptr_00 + 10) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        free(__ptr_00);
        goto LAB_00101bbd;
      }
    }
    __ptr->private_data = __ptr_00;
    if (__ptr_00 != (undefined4 *)0x0) {
      __ptr->vt = &linear_state_vt;
      *(undefined1 *)(__ptr_00 + 1) = 0;
      SVar2 = SRC_ERR_NO_ERROR;
      memset(*(void **)(__ptr_00 + 10),0,(ulong)(uint)channels << 2);
      goto LAB_00101bfc;
    }
    free(__ptr);
  }
  __ptr = (SRC_STATE *)0x0;
LAB_00101bfc:
  *error = SVar2;
  return __ptr;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
linear_state_new (int channels, SRC_ERROR *error)
{
	assert (channels > 0) ;
	assert (error != NULL) ;

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	state->private_data = linear_data_new (state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->vt = &linear_state_vt ;

	linear_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}